

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_val_get_format(uint32_t options,LY_VALUE_FORMAT *format)

{
  LY_VALUE_FORMAT *format_local;
  uint32_t options_local;
  
  if (format == (LY_VALUE_FORMAT *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","format",
           "lyd_new_val_get_format");
    format_local._4_4_ = LY_EVALID;
  }
  else if (((options & 4) == 0) || ((options & 8) == 0)) {
    if ((options & 4) == 0) {
      if ((options & 8) == 0) {
        *format = LY_VALUE_JSON;
      }
      else {
        *format = LY_VALUE_CANON;
      }
    }
    else {
      *format = LY_VALUE_LYB;
    }
    format_local._4_4_ = LY_SUCCESS;
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "!((options & 0x04) && (options & 0x08))","lyd_new_val_get_format");
    format_local._4_4_ = LY_EVALID;
  }
  return format_local._4_4_;
}

Assistant:

static LY_ERR
lyd_new_val_get_format(uint32_t options, LY_VALUE_FORMAT *format)
{
    LY_CHECK_ARG_RET(NULL, format, !((options & LYD_NEW_VAL_BIN) && (options & LYD_NEW_VAL_CANON)), LY_EVALID);

    if (options & LYD_NEW_VAL_BIN) {
        *format = LY_VALUE_LYB;
    } else if (options & LYD_NEW_VAL_CANON) {
        *format = LY_VALUE_CANON;
    } else {
        *format = LY_VALUE_JSON;
    }

    return LY_SUCCESS;
}